

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  bool pointy;
  int num_zeros;
  sign_t sign;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_76 [2];
  undefined1 local_74 [12];
  float_specs local_68;
  float_specs local_60;
  undefined1 local_54 [8];
  undefined4 uStack_4c;
  float_specs local_48;
  undefined8 local_40;
  undefined8 local_38;
  float_specs *local_30;
  char *local_28;
  int *local_20;
  
  local_60 = (float_specs)fp->significand;
  local_74._8_4_ = fp->significand_size;
  local_68._4_4_ = fspecs._4_4_;
  local_74._4_4_ = (uint)local_68._4_4_ >> 8 & 0xff;
  local_76[0] = decimal_point;
  local_68 = fspecs;
  if ((int)local_74._8_4_ < 0) goto LAB_0017bb8b;
  uVar3 = (ulong)((local_74._8_4_ + 1) - (uint)(local_74._4_4_ == none));
  uVar1 = fp->exponent;
  local_54._0_4_ = uVar1 + local_74._8_4_;
  iVar7 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0017b9af:
    iVar6 = uVar1 + local_74._8_4_ + -1;
    if (((uint)local_68._4_4_ >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_74._8_4_ == 1) {
        local_76[0] = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < iVar7 - local_74._8_4_) {
        uVar5 = (ulong)(uint)(iVar7 - local_74._8_4_);
      }
      uVar3 = uVar3 + uVar5;
    }
    stack0xffffffffffffffb0 =
         (sign_t *)(CONCAT44(uStack_4c,(uint)local_68._4_4_ >> 8) & 0xffffffff000000ff);
    local_40._0_5_ = CONCAT14(local_76[0],local_74._8_4_);
    local_38 = (big_decimal_fp *)
               (CONCAT35(local_38._5_3_,
                         CONCAT14((((uint)local_68._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
               0x4500000000);
    local_30 = (float_specs *)CONCAT44(local_30._4_4_,iVar6);
    local_48 = local_60;
    if (specs->width < 1) {
      bVar2.container =
           (buffer<char> *)
           write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
           anon_class_40_7_ef14d3db::operator()
                     ((anon_class_40_7_ef14d3db *)(local_54 + 4),
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_54._0_4_ < 1) {
        iVar6 = 1 - local_54._0_4_;
      }
      lVar4 = 2;
      if (99 < iVar6) {
        lVar4 = (ulong)(999 < iVar6) + 3;
      }
      sVar8 = uVar3 + (3 - (ulong)(local_76[0] == '\0')) + lVar4;
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                     (out,specs,sVar8,sVar8,(anon_class_40_7_ef14d3db *)(local_54 + 4));
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar6 = 0x10;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (((int)local_54._0_4_ < -3) || (iVar6 < (int)local_54._0_4_)) goto LAB_0017b9af;
    }
    if ((int)uVar1 < 0) {
      if ((int)local_54._0_4_ < 1) {
        iVar6 = -local_54._0_4_;
        local_74._0_4_ = iVar6;
        if (SBORROW4(iVar7,iVar6) != iVar7 + local_54._0_4_ < 0) {
          local_74._0_4_ = iVar7;
        }
        if (iVar7 < 0) {
          local_74._0_4_ = iVar6;
        }
        if (local_74._8_4_ != 0) {
          local_74._0_4_ = iVar6;
        }
        local_76[1] = ((ulong)fspecs & 0x10000000000000) != 0 ||
                      (local_74._8_4_ != 0 || local_74._0_4_ != 0);
        if ((int)local_74._0_4_ < 0) {
LAB_0017bb8b:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/spdlog/fmt/bundled/core.h"
                      ,0x19e,"negative value");
        }
        sVar8 = ((uint)(byte)local_76[1] + local_74._0_4_ + 1) + uVar3;
        unique0x100002a6 = (sign_t *)((long)local_74 + 4);
        local_48 = (float_specs)((long)local_76 + 1);
        local_40 = (int *)local_76;
        local_38 = (big_decimal_fp *)local_74;
        local_30 = &local_60;
        local_28 = (char *)((long)local_74 + 8);
        bVar2.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_&>
                       (out,specs,sVar8,sVar8,(anon_class_48_6_d9b5e731 *)(local_54 + 4));
      }
      else {
        local_74._0_4_ = iVar7 - local_74._8_4_ & (int)(local_68._4_4_ << 0xb) >> 0x1f;
        local_28 = local_74;
        uVar5 = (ulong)(uint)local_74._0_4_;
        if ((int)local_74._0_4_ < 1) {
          uVar5 = 0;
        }
        sVar8 = uVar3 + uVar5 + 1;
        unique0x10000286 = (sign_t *)((long)local_74 + 4);
        local_48 = (float_specs)&local_60;
        local_40 = (int *)((long)local_74 + 8);
        local_38 = (big_decimal_fp *)local_54;
        local_30 = (float_specs *)local_76;
        bVar2.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_&>
                       (out,specs,sVar8,sVar8,(anon_class_48_6_48d028d1 *)(local_54 + 4));
      }
    }
    else {
      sVar8 = uVar1 + uVar3;
      local_74._0_4_ = iVar7 - local_54._0_4_;
      if (((uint)local_68._4_4_ >> 0x14 & 1) != 0) {
        if (fspecs._4_1_ != '\x02' && (int)local_74._0_4_ < 1) {
          local_74._0_4_ = 1;
        }
        if (0 < (int)local_74._0_4_) {
          sVar8 = sVar8 + (uint)local_74._0_4_ + 1;
        }
      }
      unique0x10000266 = (sign_t *)((long)local_74 + 4);
      local_48 = (float_specs)&local_60;
      local_40 = (int *)((long)local_74 + 8);
      local_30 = &local_68;
      local_28 = local_76;
      local_20 = (int *)local_74;
      local_38 = fp;
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_&>
                     (out,specs,sVar8,sVar8,(anon_class_56_7_a2a26a24 *)(local_54 + 4));
    }
  }
  return (appender)bVar2.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}